

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O0

uint128 * __thiscall trng::portable_impl::uint128::operator/=(uint128 *this,uint128 other)

{
  uint128 other_00;
  uint128 b;
  uint128 a;
  uint128 other_01;
  uint128 b_00;
  uint128 a_00;
  bool bVar1;
  uint128 *in_RDX;
  uint64_t in_RSI;
  uint128 *in_RDI;
  int i_1;
  int i;
  uint128 r;
  uint128 q;
  int in_stack_ffffffffffffff6c;
  uint128 *in_stack_ffffffffffffff70;
  int local_74;
  int local_3c;
  uint128 local_38;
  uint128 local_28;
  uint64_t local_10;
  uint128 *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDX;
  uint128(&local_28);
  uint128(&local_38);
  for (local_3c = 0x7f; 0x3f < local_3c; local_3c = local_3c + -1) {
    operator<<=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    local_38.m_lo =
         (long)(int)(uint)((in_RDI->m_hi & 1L << ((char)local_3c - 0x40U & 0x3f)) != 0) |
         local_38.m_lo;
    a_00.m_hi = local_38.m_hi;
    a_00.m_lo = local_38.m_lo;
    b_00.m_hi = (uint64_t)local_8;
    b_00.m_lo = local_10;
    bVar1 = operator>=(a_00,b_00);
    if (bVar1) {
      other_01.m_hi = (uint64_t)local_8;
      other_01.m_lo = local_10;
      operator-=(&local_38,other_01);
      local_28.m_hi = 1L << ((char)local_3c - 0x40U & 0x3f) | local_28.m_hi;
    }
  }
  for (local_74 = 0x3f; -1 < local_74; local_74 = local_74 + -1) {
    operator<<=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    local_38.m_lo =
         (long)(int)(uint)((in_RDI->m_lo & 1L << ((byte)local_74 & 0x3f)) != 0) | local_38.m_lo;
    in_stack_ffffffffffffff6c = (int)(local_10 >> 0x20);
    a.m_hi = local_38.m_hi;
    a.m_lo = local_38.m_lo;
    b.m_hi = (uint64_t)local_8;
    b.m_lo = local_10;
    in_stack_ffffffffffffff70 = local_8;
    bVar1 = operator>=(a,b);
    if (bVar1) {
      other_00.m_hi = (uint64_t)local_8;
      other_00.m_lo = local_10;
      operator-=(&local_38,other_00);
      local_28.m_lo = 1L << ((byte)local_74 & 0x3f) | local_28.m_lo;
    }
  }
  in_RDI->m_lo = local_28.m_lo;
  in_RDI->m_hi = local_28.m_hi;
  return in_RDI;
}

Assistant:

uint128 &operator/=(uint128 other) {
        uint128 q;
        uint128 r;
        for (int i{127}; i >= 64; --i) {
          r <<= 1;
          r.m_lo |= (this->m_hi & (1ull << (i - 64))) > 0 ? 1 : 0;
          if (r >= other) {
            r -= other;
            q.m_hi |= 1ull << (i - 64);
          }
        }
        for (int i{63}; i >= 0; --i) {
          r <<= 1;
          r.m_lo |= (this->m_lo & (1ull << i)) > 0 ? 1 : 0;
          if (r >= other) {
            r -= other;
            q.m_lo |= 1ull << i;
          }
        }
        this->m_lo = q.m_lo;
        this->m_hi = q.m_hi;
        return *this;
      }